

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O1

void Assimp::ExportScene3DS
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *this;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> scenecopy;
  aiScene *scenecopy_tmp;
  SplitLargeMeshesProcess_Triangle tri_splitter;
  shared_ptr<Assimp::IOStream> outfile;
  SplitLargeMeshesProcess_Vertex vert_splitter;
  Discreet3DSExporter exporter;
  _Head_base<0UL,_aiScene_*,_false> local_120;
  _Head_base<0UL,_aiScene_*,_false> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  shared_ptr<Assimp::IOStream> local_f0;
  SplitLargeMeshesProcess_Vertex local_e0;
  Discreet3DSExporter local_c0;
  
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wb");
  local_f0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(extraout_var,iVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_f0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             local_f0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (local_f0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (IOStream *)0x0) {
    SceneCombiner::CopyScene(&local_118._M_head_impl,pScene,true);
    local_120._M_head_impl = local_118._M_head_impl;
    SplitLargeMeshesProcess_Triangle::SplitLargeMeshesProcess_Triangle
              ((SplitLargeMeshesProcess_Triangle *)&local_110);
    local_110.field_2._8_4_ = 0xffff;
    SplitLargeMeshesProcess_Triangle::Execute
              ((SplitLargeMeshesProcess_Triangle *)&local_110,local_120._M_head_impl);
    SplitLargeMeshesProcess_Vertex::SplitLargeMeshesProcess_Vertex(&local_e0);
    local_e0.LIMIT = 0xffff;
    SplitLargeMeshesProcess_Vertex::Execute(&local_e0,local_120._M_head_impl);
    Discreet3DSExporter::Discreet3DSExporter(&local_c0,&local_f0,local_120._M_head_impl);
    std::
    _Rb_tree<const_aiNode_*,_std::pair<const_aiNode_*const,_unsigned_int>,_std::_Select1st<std::pair<const_aiNode_*const,_unsigned_int>_>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
    ::~_Rb_tree(&local_c0.meshes._M_t);
    std::
    _Rb_tree<const_aiNode_*,_std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
    ::~_Rb_tree(&local_c0.trafos._M_t);
    StreamWriter<false,_false>::~StreamWriter(&local_c0.writer);
    SplitLargeMeshesProcess_Vertex::~SplitLargeMeshesProcess_Vertex(&local_e0);
    SplitLargeMeshesProcess_Triangle::~SplitLargeMeshesProcess_Triangle
              ((SplitLargeMeshesProcess_Triangle *)&local_110);
    std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::~unique_ptr
              ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&local_120);
    if (local_f0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f0.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,pFile,(allocator<char> *)&local_e0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 "Could not open output .3ds file: ",&local_110);
  std::runtime_error::runtime_error(this,(string *)&local_c0);
  *(undefined ***)this = &PTR__runtime_error_0082bce0;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportScene3DS(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
{
    std::shared_ptr<IOStream> outfile (pIOSystem->Open(pFile, "wb"));
    if(!outfile) {
        throw DeadlyExportError("Could not open output .3ds file: " + std::string(pFile));
    }

    // TODO: This extra copy should be avoided and all of this made a preprocess
    // requirement of the 3DS exporter.
    //
    // 3DS meshes can be max 0xffff (16 Bit) vertices and faces, respectively.
    // SplitLargeMeshes can do this, but it requires the correct limit to be set
    // which is not possible with the current way of specifying preprocess steps
    // in |Exporter::ExportFormatEntry|.
    aiScene* scenecopy_tmp;
    SceneCombiner::CopyScene(&scenecopy_tmp,pScene);
    std::unique_ptr<aiScene> scenecopy(scenecopy_tmp);

    SplitLargeMeshesProcess_Triangle tri_splitter;
    tri_splitter.SetLimit(0xffff);
    tri_splitter.Execute(scenecopy.get());

    SplitLargeMeshesProcess_Vertex vert_splitter;
    vert_splitter.SetLimit(0xffff);
    vert_splitter.Execute(scenecopy.get());

    // Invoke the actual exporter
    Discreet3DSExporter exporter(outfile, scenecopy.get());
}